

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalNN.cpp
# Opt level: O2

bool read_input(NaDataFile *df,uint vec_len,NaReal *vec)

{
  char cVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  NaReal NVar6;
  
  if (df == (NaDataFile *)0x0) {
    lVar3 = (ulong)vec_len + 1;
    do {
      lVar3 = lVar3 + -1;
      bVar5 = lVar3 == 0;
      if (bVar5) {
        return bVar5;
      }
      iVar2 = __isoc99_scanf("%lg",vec);
      vec = vec + 1;
    } while (iVar2 == 1);
  }
  else {
    if (read_input(NaDataFile*,unsigned_int,double*)::bFirst == '\0') {
      read_input(NaDataFile*,unsigned_int,double*)::bFirst = '\x01';
      cVar1 = (**(code **)(*(long *)df + 0x28))(df);
    }
    else {
      cVar1 = (**(code **)(*(long *)df + 0x20))(df);
    }
    if (cVar1 == '\0') {
      bVar5 = false;
    }
    else {
      for (uVar4 = 0; vec_len != uVar4; uVar4 = uVar4 + 1) {
        NVar6 = (NaReal)(**(code **)(*(long *)df + 0x18))(df,uVar4 & 0xffffffff);
        vec[uVar4] = NVar6;
      }
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

bool
read_input (NaDataFile* df, unsigned vec_len, NaReal* vec)
{
  static bool	bFirst = true;
  unsigned	vec_i;

  if(NULL == df)
    {
      /* read stdin */
      for(vec_i = 0; vec_i < vec_len; ++vec_i)
	if(1 != scanf("%lg", vec + vec_i))
	  return false;
    }
  else
    {
      /* read data file */
      if(bFirst)
	{
	  bFirst = false;
	  if(!df->GoStartRecord())
	    return false;
	}
      else if(!df->GoNextRecord())
	return false;

      for(vec_i = 0; vec_i < vec_len; ++vec_i)
	vec[vec_i] = df->GetValue(vec_i);
    }

  return true;
}